

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O2

bool IsSegWitOutput(SigningProvider *provider,CScript *script)

{
  uchar *puVar1;
  bool bVar2;
  TxoutType TVar3;
  int iVar4;
  bool bVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> vch;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  valtype program;
  int version;
  CScript subscript;
  uint160 h160;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  int local_7c;
  uchar local_78 [4];
  uchar auStack_74 [4];
  uchar auStack_70 [4];
  uchar auStack_6c [4];
  uchar local_68 [16];
  undefined1 local_58 [36];
  base_blob<160U> local_34;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = CScript::IsWitnessProgram
                    (script,&local_7c,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
  bVar5 = true;
  if (!bVar2) {
    bVar2 = CScript::IsPayToScriptHash(script);
    if (bVar2) {
      local_b8.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      TVar3 = Solver(script,&local_b8);
      if (TVar3 == SCRIPTHASH) {
        puVar1 = ((local_b8.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        vch.m_size = (long)((local_b8.
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
        vch.m_data = puVar1;
        base_blob<160U>::base_blob(&local_34,vch);
        local_58._16_8_ = 0;
        local_58._24_8_ = 0;
        local_58._0_8_ = (char *)0x0;
        local_58._8_8_ = 0;
        local_68[0] = local_34.m_data._M_elems[0x10];
        local_68[1] = local_34.m_data._M_elems[0x11];
        local_68[2] = local_34.m_data._M_elems[0x12];
        local_68[3] = local_34.m_data._M_elems[0x13];
        local_78[0] = local_34.m_data._M_elems[0];
        local_78[1] = local_34.m_data._M_elems[1];
        local_78[2] = local_34.m_data._M_elems[2];
        local_78[3] = local_34.m_data._M_elems[3];
        auStack_74[0] = local_34.m_data._M_elems[4];
        auStack_74[1] = local_34.m_data._M_elems[5];
        auStack_74[2] = local_34.m_data._M_elems[6];
        auStack_74[3] = local_34.m_data._M_elems[7];
        auStack_70[0] = local_34.m_data._M_elems[8];
        auStack_70[1] = local_34.m_data._M_elems[9];
        auStack_70[2] = local_34.m_data._M_elems[10];
        auStack_70[3] = local_34.m_data._M_elems[0xb];
        auStack_6c[0] = local_34.m_data._M_elems[0xc];
        auStack_6c[1] = local_34.m_data._M_elems[0xd];
        auStack_6c[2] = local_34.m_data._M_elems[0xe];
        auStack_6c[3] = local_34.m_data._M_elems[0xf];
        iVar4 = (*provider->_vptr_SigningProvider[2])(provider);
        if ((char)iVar4 != '\0') {
          bVar2 = CScript::IsWitnessProgram
                            ((CScript *)local_58,&local_7c,
                             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
          if (bVar2) {
            prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
            std::
            vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ::~vector(&local_b8);
            goto LAB_005f1c49;
          }
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_58);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector(&local_b8);
    }
    bVar5 = false;
  }
LAB_005f1c49:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool IsSegWitOutput(const SigningProvider& provider, const CScript& script)
{
    int version;
    valtype program;
    if (script.IsWitnessProgram(version, program)) return true;
    if (script.IsPayToScriptHash()) {
        std::vector<valtype> solutions;
        auto whichtype = Solver(script, solutions);
        if (whichtype == TxoutType::SCRIPTHASH) {
            auto h160 = uint160(solutions[0]);
            CScript subscript;
            if (provider.GetCScript(CScriptID{h160}, subscript)) {
                if (subscript.IsWitnessProgram(version, program)) return true;
            }
        }
    }
    return false;
}